

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O3

void __thiscall
ut11::
Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
::operator()(Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
            function<void_()> *args_1)

{
  pointer pcVar1;
  _Any_data local_60;
  code *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->m_callbackHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_callbackHandler)._M_invoker)((_Any_data *)this,args,args_1);
  }
  pcVar1 = (args->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + args->_M_string_length);
  std::function<void_()>::function((function<void_()> *)&local_60,args_1);
  detail::
  MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::AddCall(&this->m_argumentHandler,&local_40,(function<void_()> *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  detail::
  MockReturnHandler<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::operator()(&this->m_returnHandler,args,args_1);
  return;
}

Assistant:

R operator()(ARGS... args)
		{
			if ( m_callbackHandler )
				m_callbackHandler(args...);

			m_argumentHandler.AddCall(args...);
			return m_returnHandler(args...);
		}